

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_inl.h
# Opt level: O2

char * __thiscall
google::protobuf::internal::ExtensionSet::
ParseMessageSetItemTmpl<google::protobuf::MessageLite,std::__cxx11::string>
          (ExtensionSet *this,char *ptr,MessageLite *containing_type,InternalMetadata *metadata,
          ParseContext *ctx)

{
  byte *ptr_00;
  FieldDescriptor *pFVar1;
  bool bVar2;
  uint32 size;
  int iVar3;
  MessageLite *pMVar4;
  undefined4 extraout_var;
  char *pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  ParseContext *s;
  undefined4 uVar7;
  byte *pbVar8;
  StringPiece val;
  undefined1 local_118 [8];
  ParseContext tmp_ctx;
  ExtensionInfo extension;
  string payload;
  uint64 tmp;
  char *p;
  uint local_4c;
  ExtensionSet *pEStack_48;
  uint32 tag;
  bool local_39;
  byte *pbStack_38;
  bool was_packed_on_wire;
  char *ptr_local;
  
  extension.descriptor = (FieldDescriptor *)&payload._M_string_length;
  payload._M_dataplus._M_p = (pointer)0x0;
  payload._M_string_length._0_1_ = 0;
  p = (char *)containing_type;
  pEStack_48 = this;
  pbStack_38 = (byte *)ptr;
LAB_0014c94b:
  uVar7 = 0;
LAB_0014c94e:
  bVar2 = ParseContext::Done(ctx,(char **)&stack0xffffffffffffffc8);
  pbVar8 = pbStack_38;
  if (bVar2) goto LAB_0014cb5c;
  ptr_00 = pbStack_38 + 1;
  local_4c = (uint)*pbStack_38;
  if (local_4c == 0x1a) {
    if (uVar7 == 0) {
      pbStack_38 = ptr_00;
      size = ReadSize((char **)&stack0xffffffffffffffc8);
      if (pbStack_38 == (byte *)0x0) goto LAB_0014cb4c;
      pbStack_38 = (byte *)EpsCopyInputStream::ReadString
                                     (&ctx->super_EpsCopyInputStream,(char *)pbStack_38,size,
                                      (string *)&extension.descriptor);
    }
    else {
      pbStack_38 = ptr_00;
      pbStack_38 = (byte *)ParseField(pEStack_48,(ulong)(uint)uVar7 * 8 + 2,(char *)ptr_00,
                                      (MessageLite *)p,metadata,ctx);
    }
    uVar7 = 0;
LAB_0014ca9e:
    if (pbStack_38 != (byte *)0x0) goto LAB_0014c94e;
  }
  else {
    if (*pbStack_38 != 0x10) {
      pbStack_38 = ptr_00;
      pbStack_38 = (byte *)ReadTag((char *)pbVar8,&local_4c,0);
      if (((ulong)local_4c == 0) || ((local_4c & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_4c - 1;
        pbVar8 = pbStack_38;
        goto LAB_0014cb5c;
      }
      pbStack_38 = (byte *)ParseField(pEStack_48,(ulong)local_4c,(char *)pbStack_38,(MessageLite *)p
                                      ,metadata,ctx);
      goto LAB_0014ca9e;
    }
    pbStack_38 = ptr_00;
    pbStack_38 = (byte *)ParseBigVarint((char *)ptr_00,(uint64 *)(payload.field_2._M_local_buf + 8))
    ;
    uVar7 = payload.field_2._8_4_;
    if (pbStack_38 == (byte *)0x0) goto LAB_0014cb4c;
    if (payload._M_dataplus._M_p == (pointer)0x0) goto LAB_0014c94e;
    s = ctx;
    bVar2 = FindExtension(pEStack_48,2,payload.field_2._8_4_,(MessageLite *)p,ctx,
                          (ExtensionInfo *)&tmp_ctx.data_.factory,&local_39);
    pFVar1 = extension.descriptor;
    if (!bVar2) goto LAB_0014cb0c;
    if (tmp_ctx.data_.factory._1_1_ == '\x01') {
      pMVar4 = AddMessage(pEStack_48,uVar7,'\v',(MessageLite *)extension._0_8_,
                          (FieldDescriptor *)extension.field_3.enum_validity_check.arg);
    }
    else {
      pMVar4 = MutableMessage(pEStack_48,uVar7,'\v',(MessageLite *)extension._0_8_,
                              (FieldDescriptor *)extension.field_3.enum_validity_check.arg);
    }
    ParseContext::ParseContext<std::__cxx11::string&>
              ((ParseContext *)local_118,ctx->depth_,false,(char **)&tmp,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &extension.descriptor);
    tmp_ctx.depth_ = *(int *)&(ctx->data_).pool;
    tmp_ctx.group_depth_ = *(int *)((long)&(ctx->data_).pool + 4);
    tmp_ctx.data_.pool._0_4_ = *(undefined4 *)&(ctx->data_).factory;
    tmp_ctx.data_.pool._4_4_ = *(undefined4 *)((long)&(ctx->data_).factory + 4);
    iVar3 = (*pMVar4->_vptr_MessageLite[0xb])(pMVar4,tmp,(ParseContext *)local_118);
    if ((CONCAT44(extraout_var,iVar3) != 0) &&
       (uVar7 = 0, (int)tmp_ctx.super_EpsCopyInputStream.aliasing_ == 0)) goto LAB_0014c94e;
  }
LAB_0014cb4c:
  pbVar8 = (byte *)0x0;
LAB_0014cb5c:
  std::__cxx11::string::~string((string *)&extension.descriptor);
  return (char *)pbVar8;
LAB_0014cb0c:
  pcVar5 = (char *)StringPiece::CheckedSsizeTFromSizeT((size_t)payload._M_dataplus._M_p);
  if (((ulong)metadata->ptr_ & 1) == 0) {
    pbVar6 = InternalMetadata::mutable_unknown_fields_slow<std::__cxx11::string>(metadata);
  }
  else {
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (((ulong)metadata->ptr_ & 0xfffffffffffffffe) + 8);
  }
  val.length_ = (stringpiece_ssize_type)pbVar6;
  val.ptr_ = pcVar5;
  WriteLengthDelimited((internal *)(ulong)(uint)uVar7,(uint32)pFVar1,val,(string *)s);
  goto LAB_0014c94b;
}

Assistant:

const char* ExtensionSet::ParseMessageSetItemTmpl(
    const char* ptr, const Msg* containing_type,
    internal::InternalMetadata* metadata, internal::ParseContext* ctx) {
  std::string payload;
  uint32 type_id = 0;
  while (!ctx->Done(&ptr)) {
    uint32 tag = static_cast<uint8>(*ptr++);
    if (tag == WireFormatLite::kMessageSetTypeIdTag) {
      uint64 tmp;
      ptr = ParseBigVarint(ptr, &tmp);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      type_id = tmp;
      if (!payload.empty()) {
        ExtensionInfo extension;
        bool was_packed_on_wire;
        if (!FindExtension(2, type_id, containing_type, ctx, &extension,
                           &was_packed_on_wire)) {
          WriteLengthDelimited(type_id, payload,
                               metadata->mutable_unknown_fields<T>());
        } else {
          MessageLite* value =
              extension.is_repeated
                  ? AddMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                               *extension.message_info.prototype,
                               extension.descriptor)
                  : MutableMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                                   *extension.message_info.prototype,
                                   extension.descriptor);

          const char* p;
          // We can't use regular parse from string as we have to track
          // proper recursion depth and descriptor pools.
          ParseContext tmp_ctx(ctx->depth(), false, &p, payload);
          tmp_ctx.data().pool = ctx->data().pool;
          tmp_ctx.data().factory = ctx->data().factory;
          GOOGLE_PROTOBUF_PARSER_ASSERT(value->_InternalParse(p, &tmp_ctx) &&
                                         tmp_ctx.EndedAtLimit());
        }
        type_id = 0;
      }
    } else if (tag == WireFormatLite::kMessageSetMessageTag) {
      if (type_id != 0) {
        ptr = ParseFieldMaybeLazily(static_cast<uint64>(type_id) * 8 + 2, ptr,
                                    containing_type, metadata, ctx);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
        type_id = 0;
      } else {
        int32 size = ReadSize(&ptr);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        ptr = ctx->ReadString(ptr, size, &payload);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      }
    } else {
      ptr = ReadTag(ptr - 1, &tag);
      if (tag == 0 || (tag & 7) == 4) {
        ctx->SetLastTag(tag);
        return ptr;
      }
      ptr = ParseField(tag, ptr, containing_type, metadata, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    }
  }
  return ptr;
}